

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O0

int gotobop(int f,int n)

{
  bool bVar1;
  ushort **ppuVar2;
  int iVar3;
  bool bVar4;
  int local_18;
  int nospace;
  int col;
  int n_local;
  int f_local;
  
  nospace = n;
  if (n < 0) {
    n_local = gotoeop(f,-n);
  }
  else {
LAB_0011a8cb:
    iVar3 = nospace + -1;
    if (0 < nospace) {
      bVar1 = false;
      while (nospace = iVar3, curwp->w_dotp->l_bp != curbp->b_headp) {
        curwp->w_doto = 0;
        local_18 = 0;
        while( true ) {
          bVar4 = false;
          if (local_18 < curwp->w_dotp->l_used) {
            ppuVar2 = __ctype_b_loc();
            bVar4 = ((*ppuVar2)[(int)(uint)(byte)curwp->w_dotp->l_text[local_18]] & 0x2000) != 0;
          }
          if (!bVar4) break;
          local_18 = local_18 + 1;
        }
        if (local_18 < curwp->w_dotp->l_used) {
          bVar1 = true;
        }
        else if (bVar1) break;
        curwp->w_dotline = curwp->w_dotline + -1;
        curwp->w_dotp = curwp->w_dotp->l_bp;
      }
      goto LAB_0011a8cb;
    }
    curwp->w_rflag = curwp->w_rflag | 2;
    n_local = 1;
  }
  return n_local;
}

Assistant:

int
gotobop(int f, int n)
{
	int col, nospace;

	/* the other way... */
	if (n < 0)
		return (gotoeop(f, -n));

	while (n-- > 0) {
		nospace = 0;
		while (lback(curwp->w_dotp) != curbp->b_headp) {
			curwp->w_doto = 0;
			col = 0;

			while (col < llength(curwp->w_dotp) &&
			    (isspace(lgetc(curwp->w_dotp, col))))
				col++;

			if (col >= llength(curwp->w_dotp)) {
				if (nospace)
					break;
			} else
				nospace = 1;

			curwp->w_dotline--;
			curwp->w_dotp = lback(curwp->w_dotp);
		}
	}
	/* force screen update */
	curwp->w_rflag |= WFMOVE;
	return (TRUE);
}